

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixelshuffle.cpp
# Opt level: O1

int __thiscall
ncnn::PixelShuffle::forward(PixelShuffle *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined4 *puVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 *puVar15;
  int iVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  ulong local_80;
  ulong local_78;
  undefined4 *local_70;
  undefined4 *local_68;
  
  iVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  iVar10 = this->upscale_factor;
  uVar9 = (long)bottom_blob->c / (long)(iVar10 * iVar10);
  iVar16 = (int)uVar9;
  Mat::create(top_blob,iVar10 * iVar1,uVar2 * iVar10,iVar16,bottom_blob->elemsize,
              opt->blob_allocator);
  iVar10 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < iVar16) {
      local_68 = (undefined4 *)top_blob->data;
      sVar4 = top_blob->elemsize;
      uVar3 = this->upscale_factor;
      lVar11 = (long)top_blob->w * sVar4;
      sVar5 = top_blob->cstep;
      local_80 = 0;
      do {
        if (0 < (int)uVar3) {
          pvVar6 = bottom_blob->data;
          sVar7 = bottom_blob->cstep;
          sVar8 = bottom_blob->elemsize;
          local_70 = local_68;
          local_78 = 0;
          do {
            if (0 < (int)uVar3) {
              iVar10 = this->upscale_factor;
              uVar14 = 0;
              puVar15 = local_70;
              do {
                if (0 < (int)uVar2) {
                  puVar17 = (undefined4 *)
                            ((uVar14 + (long)(int)(((int)local_78 + (int)local_80 * uVar3) * uVar3))
                             * sVar7 * sVar8 + (long)pvVar6);
                  uVar13 = 0;
                  puVar12 = puVar15;
                  do {
                    puVar18 = puVar12;
                    iVar16 = iVar1;
                    if (0 < iVar1) {
                      do {
                        *puVar18 = *puVar17;
                        puVar17 = puVar17 + 1;
                        puVar18 = puVar18 + iVar10;
                        iVar16 = iVar16 + -1;
                      } while (iVar16 != 0);
                    }
                    uVar13 = uVar13 + 1;
                    puVar12 = (undefined4 *)((long)puVar12 + lVar11 * iVar10);
                  } while (uVar13 != uVar2);
                }
                uVar14 = uVar14 + 1;
                puVar15 = puVar15 + 1;
              } while (uVar14 != uVar3);
            }
            local_78 = local_78 + 1;
            local_70 = (undefined4 *)((long)local_70 + lVar11);
          } while (local_78 != uVar3);
        }
        local_80 = local_80 + 1;
        local_68 = (undefined4 *)((long)local_68 + sVar4 * sVar5);
      } while (local_80 != (uVar9 & 0xffffffff));
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int PixelShuffle::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w * upscale_factor;
    int outh = h * upscale_factor;
    int outc = channels / (upscale_factor * upscale_factor);

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outc; p++)
    {
        Mat m = top_blob.channel(p);

        for (int sh = 0; sh < upscale_factor; sh++)
        {
            for (int sw = 0; sw < upscale_factor; sw++)
            {
                const float* sptr = bottom_blob.channel(p*upscale_factor*upscale_factor + sh*upscale_factor + sw);

                for (int i = 0; i < h; i++)
                {
                    float* outptr = m.row(i*upscale_factor + sh) + sw;
                    for (int j = 0; j < w; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr++;
                        outptr += upscale_factor;
                    }
                }
            }
        }
    }

    return 0;
}